

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.cpp
# Opt level: O0

bool __thiscall idx2::linear_allocator::Alloc(linear_allocator *this,buffer *Buf,i64 Bytes)

{
  bool bVar1;
  i64 Bytes_local;
  buffer *Buf_local;
  linear_allocator *this_local;
  
  bVar1 = this->CurrentBytes + Bytes <= (this->Block).Bytes;
  if (bVar1) {
    Buf->Data = (this->Block).Data + this->CurrentBytes;
    Buf->Bytes = Bytes;
    Buf->Alloc = (allocator *)this;
    this->CurrentBytes = Bytes + this->CurrentBytes;
  }
  return bVar1;
}

Assistant:

bool
linear_allocator::Alloc(buffer* Buf, i64 Bytes)
{
  if (CurrentBytes + Bytes <= Block.Bytes)
  {
    Buf->Data = Block.Data + CurrentBytes;
    Buf->Bytes = Bytes;
    Buf->Alloc = this;
    CurrentBytes += Bytes;
    return true;
  }
  return false;
}